

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

SquareMatrix<double,_3> * OpenMD::SquareMatrix<double,_3>::identity(void)

{
  uint i;
  long lVar1;
  double (*padVar2) [3];
  uint j;
  long lVar3;
  double (*in_RDI) [3];
  uint uVar4;
  
  SquareMatrix((SquareMatrix<double,_3> *)in_RDI);
  padVar2 = in_RDI;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      uVar4 = 0x3ff00000;
      if (lVar1 != lVar3) {
        uVar4 = 0;
      }
      ((RectMatrix<double,_3U,_3U> *)*padVar2)->data_[0][lVar3] = (double)((ulong)uVar4 << 0x20);
    }
    padVar2 = padVar2 + 1;
  }
  return (SquareMatrix<double,_3> *)in_RDI;
}

Assistant:

static SquareMatrix<Real, Dim> identity() {
      SquareMatrix<Real, Dim> m;

      for (unsigned int i = 0; i < Dim; i++)
        for (unsigned int j = 0; j < Dim; j++)
          if (i == j)
            m(i, j) = 1.0;
          else
            m(i, j) = 0.0;

      return m;
    }